

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O1

_Bool percentile_iter_next(hdr_iter *iter)

{
  int iVar1;
  hdr_histogram *phVar2;
  long lVar3;
  int iVar4;
  byte bVar5;
  ulong uVar6;
  double dVar7;
  
  if (iter->cumulative_count < iter->total_count) {
    if (iter->counts_index != -1) goto LAB_00102434;
    if (-1 < iter->h->counts_len) {
      do {
        move_next(iter);
LAB_00102434:
        phVar2 = iter->h;
        if ((iter->count != 0) &&
           (dVar7 = (iter->specifics).percentiles.percentile_to_iterate_to,
           dVar7 <= ((double)iter->cumulative_count * 100.0) / (double)phVar2->total_count)) {
          uVar6 = phVar2->sub_bucket_mask | iter->value;
          lVar3 = 0x3f;
          if (uVar6 != 0) {
            for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          bVar5 = 0x3f - (((byte)lVar3 ^ 0x3f) + (char)phVar2->sub_bucket_half_count_magnitude);
          iVar4 = (int)(iter->value >> (bVar5 & 0x3f));
          iVar1 = phVar2->sub_bucket_count;
          iter->value_iterated_from = iter->value_iterated_to;
          iter->value_iterated_to =
               ((long)iVar4 << (bVar5 & 0x3f)) + (1L << ((iVar1 <= iVar4) + bVar5 & 0x3f)) + -1;
          (iter->specifics).percentiles.percentile = dVar7;
          dVar7 = log(100.0 / (100.0 - dVar7));
          dVar7 = exp2((double)((long)(dVar7 / 0.6931471805599453) + 1));
          (iter->specifics).percentiles.percentile_to_iterate_to =
               100.0 / (double)((long)(iter->specifics).percentiles.ticks_per_half_distance *
                               (long)dVar7) + (iter->specifics).percentiles.percentile_to_iterate_to
          ;
          return true;
        }
        if (iter->total_count <= iter->cumulative_count) {
          return true;
        }
      } while (iter->counts_index < phVar2->counts_len);
      return true;
    }
  }
  else if ((iter->specifics).percentiles.seen_last_value == false) {
    (iter->specifics).percentiles.seen_last_value = true;
    (iter->specifics).linear.next_value_reporting_level = 0x4059000000000000;
    return true;
  }
  return false;
}

Assistant:

static bool percentile_iter_next(struct hdr_iter* iter)
{
    int64_t temp, half_distance, percentile_reporting_ticks;

    struct hdr_iter_percentiles* percentiles = &iter->specifics.percentiles;

    if (!has_next(iter))
    {
        if (percentiles->seen_last_value)
        {
            return false;
        }

        percentiles->seen_last_value = true;
        percentiles->percentile = 100.0;

        return true;
    }

    if (iter->counts_index == -1 && !basic_iter_next(iter))
    {
        return false;
    }

    do
    {
        double current_percentile = (100.0 * (double) iter->cumulative_count) / iter->h->total_count;
        if (iter->count != 0 &&
                percentiles->percentile_to_iterate_to <= current_percentile)
        {
            update_iterated_values(iter, highest_equivalent_value(iter->h, iter->value));

            percentiles->percentile = percentiles->percentile_to_iterate_to;
            temp = (int64_t)(log(100 / (100.0 - (percentiles->percentile_to_iterate_to))) / log(2)) + 1;
            half_distance = (int64_t) pow(2, (double) temp);
            percentile_reporting_ticks = percentiles->ticks_per_half_distance * half_distance;
            percentiles->percentile_to_iterate_to += 100.0 / percentile_reporting_ticks;

            return true;
        }
    }
    while (basic_iter_next(iter));

    return true;
}